

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O2

_Bool MOS65XX_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  _Bool _Var1;
  mos65xx_insn mVar2;
  mos65xx_address_mode mVar3;
  cs_detail *pcVar4;
  uint uVar5;
  byte bVar6;
  ulong Val;
  mos65xx_reg mVar7;
  mos65xx_address_mode am;
  ulong uVar8;
  
  if (code_len == 0) {
    *size = 1;
    return false;
  }
  bVar6 = *code;
  mVar2 = OpInfoTable[bVar6].ins;
  uVar8 = (ulong)mVar2;
  if (uVar8 == 0) {
LAB_001c0bb0:
    *size = 1;
    return false;
  }
  mVar3 = OpInfoTable[bVar6].am;
  if (mVar3 - MOS65XX_AM_ABS < 0xb) {
    uVar5 = *(uint *)(&DAT_00314aa8 + (ulong)(mVar3 - MOS65XX_AM_ABS) * 4);
  }
  else {
    uVar5 = 1;
  }
  if (code_len < uVar5) goto LAB_001c0bb0;
  MI->address = address;
  MI->Opcode = (uint)bVar6;
  MI->OpcodePub = mVar2;
  MI->size = '\0';
  *size = (uint16_t)uVar5;
  if (uVar5 == 3) {
    Val = (ulong)*(ushort *)(code + 1);
LAB_001c0be7:
    MCOperand_CreateImm0(MI,Val);
  }
  else if (uVar5 == 2) {
    Val = (ulong)code[1];
    goto LAB_001c0be7;
  }
  pcVar4 = MI->flat_insn->detail;
  if (pcVar4 == (cs_detail *)0x0) {
    return true;
  }
  (pcVar4->field_6).arm64.cc = mVar3;
  _Var1 = InstructionInfoTable[uVar8].modifies_status;
  (pcVar4->field_6).x86.opcode[0] = _Var1;
  pcVar4->groups_count = '\0';
  pcVar4->regs_read_count = '\0';
  pcVar4->regs_write_count = '\0';
  (pcVar4->field_6).x86.opcode[1] = '\0';
  if (InstructionInfoTable[uVar8].group_type != MOS65XX_GRP_INVALID) {
    pcVar4->groups[0] = (uint8_t)InstructionInfoTable[uVar8].group_type;
    pcVar4->groups_count = '\x01';
  }
  mVar7 = InstructionInfoTable[uVar8].read;
  if (mVar7 != MOS65XX_REG_INVALID) goto LAB_001c0c4a;
  if (mVar3 < MOS65XX_AM_REL) {
    if ((0x540U >> (mVar3 & 0x1f) & 1) != 0) {
      mVar7 = MOS65XX_REG_X;
LAB_001c0c4a:
      pcVar4->regs_read_count = '\x01';
      pcVar4->regs_read[0] = (uint16_t)mVar7;
      goto LAB_001c0c51;
    }
    mVar7 = MOS65XX_REG_Y;
    if ((0xa80U >> (mVar3 & 0x1f) & 1) != 0) goto LAB_001c0c4a;
    if (mVar3 != MOS65XX_AM_ACC) goto LAB_001c0c51;
    pcVar4->regs_read_count = '\x01';
    pcVar4->regs_read[0] = 1;
    mVar7 = InstructionInfoTable[uVar8].write;
    if (mVar7 == MOS65XX_REG_INVALID) {
      mVar7 = MOS65XX_REG_ACC;
    }
  }
  else {
LAB_001c0c51:
    mVar7 = InstructionInfoTable[uVar8].write;
    if ((mVar7 == MOS65XX_REG_INVALID) && (mVar7 = MOS65XX_REG_ACC, mVar3 != MOS65XX_AM_ACC)) {
      bVar6 = 0;
      goto LAB_001c0c71;
    }
  }
  pcVar4->regs_write_count = '\x01';
  pcVar4->regs_write[0] = (uint16_t)mVar7;
  bVar6 = 1;
LAB_001c0c71:
  if (_Var1 != false) {
    pcVar4->regs_write_count = bVar6 + 1;
    pcVar4->regs_write[bVar6] = 4;
  }
  if (mVar3 == MOS65XX_AM_IMP) {
    return true;
  }
  if (mVar3 == MOS65XX_AM_ACC) {
    *(m68k_reg *)((long)&pcVar4->field_6 + 8) = M68K_REG_D0;
    *(m68k_reg *)((long)&pcVar4->field_6 + 0xc) = M68K_REG_D0;
  }
  else {
    if (mVar3 == MOS65XX_AM_REL) {
      return true;
    }
    if (mVar3 == MOS65XX_AM_IMM) {
      (pcVar4->field_6).arm64.operands[0].vector_index = 2;
    }
    else {
      (pcVar4->field_6).arm64.operands[0].vector_index = 3;
    }
    *(undefined2 *)((long)&pcVar4->field_6 + 0xc) = *(undefined2 *)&MI->Operands[0].field_2;
  }
  (pcVar4->field_6).x86.opcode[1] = '\x01';
  return true;
}

Assistant:

bool MOS65XX_getInstruction(csh ud, const uint8_t *code, size_t code_len,
							MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned char opcode;
	unsigned char len;
	mos65xx_insn ins;

	if (code_len == 0) {
		*size = 1;
		return false;
	}

	opcode = code[0];
	ins = OpInfoTable[opcode].ins;
	if (ins == MOS65XX_INS_INVALID) {
		*size = 1;
		return false;
	}

	len = getInstructionLength(OpInfoTable[opcode].am);
	if (code_len < len) {
		*size = 1;
		return false;
	}

	MI->address = address;
	MI->Opcode = opcode;
	MI->OpcodePub = ins;
	MI->size = 0;

	*size = len;
	if (len == 2) {
		MCOperand_CreateImm0(MI, code[1]);
	} else
	if (len == 3) {
		MCOperand_CreateImm0(MI, (code[2]<<8) | code[1]);
	}
#ifndef CAPSTONE_DIET
	if (MI->flat_insn->detail) {
		fillDetails(MI, opcode);
	}
#endif

	return true;
}